

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPRThreadPoolTest1.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ThreadPool *this;
  ostream *poVar1;
  int i;
  int iVar2;
  _Bind<void_(*(thread::ThreadPool_*))(thread::ThreadPool_*)> local_60;
  ThreadFunc local_50;
  
  this = (ThreadPool *)operator_new(0xe8);
  thread::ThreadPool::ThreadPool(this,2);
  local_60._M_f = print;
  local_60._M_bound_args.super__Tuple_impl<0UL,_thread::ThreadPool_*>.
  super__Head_base<0UL,_thread::ThreadPool_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_thread::ThreadPool_*>)(_Tuple_impl<0UL,_thread::ThreadPool_*>)this;
  std::function<void()>::
  function<std::_Bind<void(*(thread::ThreadPool*))(thread::ThreadPool*)>,void>
            ((function<void()> *)&local_50,&local_60);
  thread::ThreadPool::setThreadCallBack(this,&local_50);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  thread::ThreadPool::start();
  for (iVar2 = 0; iVar2 != 10; iVar2 = iVar2 + 1) {
    local_60._M_f = fs;
    local_60._M_bound_args.super__Tuple_impl<0UL,_thread::ThreadPool_*>.
    super__Head_base<0UL,_thread::ThreadPool_*,_false>._M_head_impl._0_4_ = iVar2;
    std::function<void()>::function<std::_Bind<void(*(int))(int)>,void>
              ((function<void()> *)&local_50,(_Bind<void_(*(int))(int)> *)&local_60);
    thread::ThreadPool::addInTaskQueue((function *)this);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    sleep(1);
  }
  thread::ThreadPool::joinAll();
  poVar1 = std::operator<<((ostream *)&std::cout,"sleep~");
  std::endl<char,std::char_traits<char>>(poVar1);
  sleep(2);
  return 0;
}

Assistant:

int main(int argc,char** argv)
{

    thread::ThreadPool* pool = new thread::ThreadPool(2);
    
    pool->setThreadCallBack(std::bind(&print,pool));

    pool->start();

    for(int i=0;i<10;++i)
    {
        pool->addInTaskQueue(std::bind(&fs,i));
        sleep(1);
    }

    pool->joinAll();

    std::cout << "sleep~" << std::endl;
    sleep(2);

    return 0;
}